

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_>::check_done
          (basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_> *this,
          error_code *ec)

{
  basic_istream<char,_std::char_traits<char>_> *pbVar1;
  bool bVar2;
  char_type *pcVar3;
  char_type *pcVar4;
  span<const_char,_18446744073709551615UL> sVar5;
  
  pbVar1 = (this->source_).source_.stream_ptr_;
  if (((&pbVar1->field_0x20)[(long)pbVar1->_vptr_basic_istream[-3]] & 1) != 0) {
    std::error_code::operator=(ec,source_error);
    return;
  }
  bVar2 = stream_source<char>::eof((stream_source<char> *)this);
  if (!bVar2) {
    while( true ) {
      pcVar4 = (this->parser_).end_input_;
      pcVar3 = (this->parser_).input_ptr_;
      if (pcVar3 == pcVar4) {
        sVar5 = json_source_adaptor<jsoncons::stream_source<char>_>::read_buffer(&this->source_,ec);
        pcVar3 = sVar5.data_;
        if (ec->_M_value != 0) {
          return;
        }
        if (sVar5.size_ == 0) {
          pcVar4 = (this->parser_).end_input_;
          pcVar3 = (this->parser_).input_ptr_;
        }
        else {
          (this->parser_).begin_input_ = pcVar3;
          pcVar4 = pcVar3 + sVar5.size_;
          (this->parser_).end_input_ = pcVar4;
          (this->parser_).input_ptr_ = pcVar3;
        }
      }
      if ((pcVar3 != pcVar4) &&
         (basic_json_parser<char,_std::allocator<char>_>::check_done(&this->parser_,ec),
         ec->_M_value != 0)) break;
      bVar2 = eof(this);
      if (bVar2) {
        return;
      }
    }
    return;
  }
  basic_json_parser<char,_std::allocator<char>_>::check_done(&this->parser_,ec);
  return;
}

Assistant:

void check_done(std::error_code& ec)
        {
            if (source_.is_error())
            {
                ec = json_errc::source_error;
                return;
            }   
            if (source_.eof())
            {
                parser_.check_done(ec);
                if (JSONCONS_UNLIKELY(ec)) return;
            }
            else
            {
                do
                {
                    if (parser_.source_exhausted())
                    {
                        auto s = source_.read_buffer(ec);
                        if (JSONCONS_UNLIKELY(ec)) return;
                        if (s.size() > 0)
                        {
                            parser_.update(s.data(),s.size());
                        }
                    }
                    if (!parser_.source_exhausted())
                    {
                        parser_.check_done(ec);
                        if (JSONCONS_UNLIKELY(ec)) return;
                    }
                }
                while (!eof());
            }
        }